

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int get_mvpred_compound_var_cost
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv,
              FULLPEL_MV_STATS *mv_stats)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  code *pcVar8;
  int iVar9;
  uint8_t *puVar10;
  int *in_RDX;
  FULLPEL_MV *in_RSI;
  long in_RDI;
  MV sub_this_mv;
  int bestsme;
  int invert_mask;
  int mask_stride;
  uint8_t *second_pred;
  uint8_t *mask;
  int ref_stride;
  int src_stride;
  uint8_t *src_buf;
  buf_2d *ref;
  buf_2d *src;
  aom_variance_fn_ptr_t *vfp;
  FULLPEL_MV *in_stack_ffffffffffffff38;
  FULLPEL_MV *pFVar11;
  buf_2d *in_stack_ffffffffffffff40;
  int local_74;
  
  lVar5 = *(long *)(in_RDI + 8);
  uVar6 = **(undefined8 **)(in_RDI + 0x18);
  uVar1 = *(undefined4 *)(*(undefined8 **)(in_RDI + 0x18) + 3);
  uVar2 = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18);
  lVar7 = *(long *)(in_RDI + 0x28);
  pFVar11 = *(FULLPEL_MV **)(in_RDI + 0x20);
  uVar3 = *(undefined4 *)(in_RDI + 0x30);
  uVar4 = *(undefined4 *)(in_RDI + 0x34);
  if (lVar7 == 0) {
    if (pFVar11 == (FULLPEL_MV *)0x0) {
      pcVar8 = *(code **)(lVar5 + 0x18);
      puVar10 = get_buf_from_fullmv(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_74 = (*pcVar8)(uVar6,uVar1,puVar10,uVar2,in_RDX + 2);
    }
    else {
      pcVar8 = *(code **)(lVar5 + 0x28);
      puVar10 = get_buf_from_fullmv(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 = (FULLPEL_MV *)(in_RDX + 2);
      local_74 = (*pcVar8)(puVar10,uVar2,0,0,uVar6,uVar1,in_stack_ffffffffffffff38,pFVar11);
    }
  }
  else {
    pcVar8 = *(code **)(lVar5 + 0x50);
    puVar10 = get_buf_from_fullmv(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_74 = (*pcVar8)(puVar10,uVar2,0,0,uVar6,uVar1,pFVar11,lVar7,uVar3,uVar4,in_RDX + 2);
    in_stack_ffffffffffffff38 = pFVar11;
  }
  in_RDX[1] = local_74;
  get_mv_from_fullmv(in_RSI);
  iVar9 = mv_err_cost_((MV *)in_stack_ffffffffffffff38,(MV_COST_PARAMS *)0x267d5f);
  *in_RDX = iVar9;
  return *in_RDX + local_74;
}

Assistant:

static inline int get_mvpred_compound_var_cost(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv,
    FULLPEL_MV_STATS *mv_stats) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const uint8_t *mask = ms_params->ms_buffers.mask;
  const uint8_t *second_pred = ms_params->ms_buffers.second_pred;
  const int mask_stride = ms_params->ms_buffers.mask_stride;
  const int invert_mask = ms_params->ms_buffers.inv_mask;
  int bestsme;

  if (mask) {
    bestsme = vfp->msvf(get_buf_from_fullmv(ref, this_mv), ref_stride, 0, 0,
                        src_buf, src_stride, second_pred, mask, mask_stride,
                        invert_mask, &mv_stats->sse);
  } else if (second_pred) {
    bestsme = vfp->svaf(get_buf_from_fullmv(ref, this_mv), ref_stride, 0, 0,
                        src_buf, src_stride, &mv_stats->sse, second_pred);
  } else {
    bestsme = vfp->vf(src_buf, src_stride, get_buf_from_fullmv(ref, this_mv),
                      ref_stride, &mv_stats->sse);
  }
  mv_stats->distortion = bestsme;

  const MV sub_this_mv = get_mv_from_fullmv(this_mv);
  mv_stats->err_cost = mv_err_cost_(&sub_this_mv, &ms_params->mv_cost_params);
  bestsme += mv_stats->err_cost;

  return bestsme;
}